

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O0

bool __thiscall xs::ExecutionRequestHandler::receive(ExecutionRequestHandler *this)

{
  Socket *this_00;
  int iVar1;
  size_type x;
  reference pvVar2;
  ConnectionError *pCVar3;
  allocator<char> local_89;
  string local_88;
  undefined1 local_65;
  allocator<char> local_51;
  string local_50;
  deSocketResult local_2c;
  int iStack_28;
  deSocketResult result;
  size_t numRecv;
  size_t maxLen;
  ExecutionRequestHandler *this_local;
  
  maxLen = (size_t)this;
  x = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_sendRecvTmpBuf);
  iVar1 = de::RingBuffer<unsigned_char>::getNumFree(&this->m_bufferIn);
  numRecv = de::min<unsigned_long>(x,(long)iVar1);
  if (numRecv == 0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = (this->super_ConnectionHandler).m_socket;
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_sendRecvTmpBuf,0);
    local_2c = de::Socket::receive(this_00,pvVar2,numRecv,(size_t *)&iStack_28);
    if (local_2c == DE_SOCKETRESULT_SUCCESS) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->m_sendRecvTmpBuf,0);
      de::RingBuffer<unsigned_char>::pushFront(&this->m_bufferIn,pvVar2,iStack_28);
      this_local._7_1_ = true;
    }
    else if (local_2c == DE_SOCKETRESULT_CONNECTION_CLOSED) {
      this->m_run = false;
      this_local._7_1_ = true;
    }
    else {
      if (local_2c != DE_SOCKETRESULT_WOULD_BLOCK) {
        if (local_2c == DE_SOCKETRESULT_CONNECTION_TERMINATED) {
          local_65 = 1;
          pCVar3 = (ConnectionError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Connection terminated",&local_51);
          ConnectionError::ConnectionError(pCVar3,&local_50);
          local_65 = 0;
          __cxa_throw(pCVar3,&ConnectionError::typeinfo,ConnectionError::~ConnectionError);
        }
        pCVar3 = (ConnectionError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"receive() failed",&local_89);
        ConnectionError::ConnectionError(pCVar3,&local_88);
        __cxa_throw(pCVar3,&ConnectionError::typeinfo,ConnectionError::~ConnectionError);
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ExecutionRequestHandler::receive (void)
{
	size_t maxLen = de::min(m_sendRecvTmpBuf.size(), (size_t)m_bufferIn.getNumFree());

	if (maxLen > 0)
	{
		size_t			numRecv;
		deSocketResult	result	= m_socket->receive(&m_sendRecvTmpBuf[0], maxLen, &numRecv);

		if (result == DE_SOCKETRESULT_SUCCESS)
		{
			DE_ASSERT(numRecv > 0);
			m_bufferIn.pushFront(&m_sendRecvTmpBuf[0], (int)numRecv);
			return true;
		}
		else if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
		{
			m_run = false;
			return true;
		}
		else if (result == DE_SOCKETRESULT_WOULD_BLOCK)
			return false;
		else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
			throw ConnectionError("Connection terminated");
		else
			throw ConnectionError("receive() failed");
	}
	else
		return false;
}